

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this)

{
  Value VVar1;
  
  VVar1 = Pop(this);
  VVar1.field_0._8_8_ = (ulong)VVar1.field_0._0_1_ * 0x101010101010101;
  VVar1.field_0.i64_ = VVar1.field_0._8_8_;
  Push(this,VVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}